

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateUpvalueClose(ExpressionContext *ctx,SynBase *source,VariableData *variable)

{
  VariableData *pVVar1;
  SynBase *pSVar2;
  uint uVar3;
  ExprBase *pEVar4;
  ExprTypeCast *this;
  TypeRef *type;
  ExprIntegerLiteral *pEVar5;
  InplaceStr local_58;
  ExprIntegerLiteral *local_48;
  ExprBase *copySize;
  ExprBase *copyOffset;
  ExprTypeCast *pEStack_30;
  uint offset;
  ExprBase *variableAddress;
  ExprBase *upvalueAddress;
  VariableData *variable_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  upvalueAddress = (ExprBase *)variable;
  variable_local = (VariableData *)source;
  source_local = (SynBase *)ctx;
  pEVar4 = GetFunctionUpvalue(ctx,source,variable);
  variableAddress = CreateGetAddress(ctx,source,pEVar4);
  pSVar2 = source_local;
  pVVar1 = variable_local;
  pEVar4 = CreateVariableAccess
                     ((ExpressionContext *)source_local,(SynBase *)variable_local,
                      (VariableData *)upvalueAddress,false);
  pEStack_30 = (ExprTypeCast *)
               CreateGetAddress((ExpressionContext *)pSVar2,(SynBase *)pVVar1,pEVar4);
  this = ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
  pVVar1 = variable_local;
  type = ExpressionContext::GetReferenceType
                   ((ExpressionContext *)source_local,*(TypeBase **)&source_local[0x226].listed);
  ExprTypeCast::ExprTypeCast
            (this,(SynBase *)pVVar1,&type->super_TypeBase,&pEStack_30->super_ExprBase,
             EXPR_CAST_REINTERPRET);
  copyOffset._4_4_ = 0x10;
  pEStack_30 = this;
  uVar3 = GetAlignmentOffset(0x10,*(uint *)&upvalueAddress->next->field_0x2c);
  copyOffset._4_4_ = uVar3 + copyOffset._4_4_;
  pEVar5 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local);
  ExprIntegerLiteral::ExprIntegerLiteral
            (pEVar5,(SynBase *)variable_local,(TypeBase *)source_local[0x227].end,
             (ulong)copyOffset._4_4_);
  copySize = &pEVar5->super_ExprBase;
  pEVar5 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local);
  ExprIntegerLiteral::ExprIntegerLiteral
            (pEVar5,(SynBase *)variable_local,(TypeBase *)source_local[0x227].end,
             (longlong)upvalueAddress->next[1]._vptr_ExprBase);
  pSVar2 = source_local;
  pVVar1 = variable_local;
  local_48 = pEVar5;
  InplaceStr::InplaceStr(&local_58,"__closeUpvalue");
  pEVar4 = CreateFunctionCall4((ExpressionContext *)pSVar2,(SynBase *)pVVar1,local_58,
                               variableAddress,&pEStack_30->super_ExprBase,copySize,
                               &local_48->super_ExprBase,false,true,true);
  return pEVar4;
}

Assistant:

ExprBase* CreateUpvalueClose(ExpressionContext &ctx, SynBase *source, VariableData *variable)
{
	ExprBase *upvalueAddress = CreateGetAddress(ctx, source, GetFunctionUpvalue(ctx, source, variable));

	ExprBase *variableAddress = CreateGetAddress(ctx, source, CreateVariableAccess(ctx, source, variable, false));

	variableAddress = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(ctx.typeVoid), variableAddress, EXPR_CAST_REINTERPRET);

	// Two pointers before data
	unsigned offset = NULLC_PTR_SIZE + NULLC_PTR_SIZE;

	offset += GetAlignmentOffset(offset, variable->type->alignment);

	ExprBase *copyOffset = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, offset);

	ExprBase *copySize = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, variable->type->size);

	return CreateFunctionCall4(ctx, source, InplaceStr("__closeUpvalue"), upvalueAddress, variableAddress, copyOffset, copySize, false, true, true);
}